

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O2

bool pstore::repo::operator==(section_content *lhs,section_content *rhs)

{
  bool bVar1;
  
  if ((lhs->kind == rhs->kind) && (lhs->align == rhs->align)) {
    bVar1 = pstore::operator==(&lhs->data,&rhs->data);
    if (bVar1) {
      bVar1 = std::operator==(&lhs->ifixups,&rhs->ifixups);
      if (bVar1) {
        bVar1 = std::operator==(&lhs->xfixups,&rhs->xfixups);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool operator== (section_content const & lhs, section_content const & rhs) {
            return lhs.kind == rhs.kind && lhs.align == rhs.align && lhs.data == rhs.data &&
                   lhs.ifixups == rhs.ifixups && lhs.xfixups == rhs.xfixups;
        }